

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcDimensionCurve::IfcDimensionCurve(IfcDimensionCurve *this)

{
  *(undefined ***)&(this->super_IfcAnnotationCurveOccurrence).field_0xa0 = &PTR__Object_007631c0;
  *(undefined8 *)&this->field_0xa8 = 0;
  *(char **)&this->field_0xb0 = "IfcDimensionCurve";
  IfcAnnotationCurveOccurrence::IfcAnnotationCurveOccurrence
            (&this->super_IfcAnnotationCurveOccurrence,&PTR_construction_vtable_24__007f5c18);
  *(undefined8 *)
   &(this->super_IfcAnnotationCurveOccurrence).super_IfcAnnotationOccurrence.super_IfcStyledItem =
       0x7f5b38;
  *(undefined8 *)&(this->super_IfcAnnotationCurveOccurrence).field_0xa0 = 0x7f5c00;
  (this->super_IfcAnnotationCurveOccurrence).super_IfcAnnotationOccurrence.super_IfcStyledItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>._vptr_ObjectHelper =
       (_func_int **)0x7f5b60;
  *(undefined8 *)
   &(this->super_IfcAnnotationCurveOccurrence).super_IfcAnnotationOccurrence.super_IfcStyledItem.
    field_0x70 = 0x7f5b88;
  *(undefined8 *)
   &(this->super_IfcAnnotationCurveOccurrence).super_IfcAnnotationOccurrence.super_IfcStyledItem.
    field_0x80 = 0x7f5bb0;
  *(undefined8 *)
   &(this->super_IfcAnnotationCurveOccurrence).super_IfcAnnotationOccurrence.field_0x90 = 0x7f5bd8;
  return;
}

Assistant:

IfcDimensionCurve() : Object("IfcDimensionCurve") {}